

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

bool __thiscall
adios2::format::BP5Deserializer::VarShape
          (BP5Deserializer *this,VariableBase *Var,size_t RelStep,Dims *Shape)

{
  byte bVar1;
  BP5VarRec *VarRec;
  pointer puVar2;
  pointer puVar3;
  size_type sVar4;
  const_iterator cVar5;
  size_type *psVar6;
  size_t *psVar7;
  ulong uVar8;
  VariableBase *local_38;
  
  local_38 = Var;
  cVar5 = std::
          _Hashtable<void_*,_std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_std::allocator<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->VarByKey)._M_h,&local_38);
  VarRec = *(BP5VarRec **)
            ((long)cVar5.
                   super__Node_iterator_base<std::pair<void_*const,_adios2::format::BP5Deserializer::BP5VarRec_*>,_false>
                   ._M_cur + 0x10);
  if ((VarRec->OrigShapeID & ~GlobalValue) == GlobalArray) {
    bVar1 = this->m_RandomAccessMode;
    if ((bool)bVar1 == true) {
      if (RelStep == 0xffffffffffffffff) {
        RelStep = Var->m_StepsStart;
      }
      RelStep = (VarRec->AbsStepFromRel).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[RelStep];
    }
    if (this->m_FlattenSteps == true) {
      RelStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == GlobalArray) {
      uVar8 = 0;
      while( true ) {
        psVar7 = &this->m_CurrentWriterCohortSize;
        if ((bVar1 & 1) != 0) {
          puVar2 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3 = (this->m_WriterCohortSize).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (RelStep < (ulong)((long)puVar3 - (long)puVar2 >> 3)) {
            psVar7 = puVar2 + RelStep;
          }
          else {
            psVar7 = puVar3 + -1;
          }
        }
        if (*psVar7 <= uVar8) break;
        psVar6 = (size_type *)GetMetadataBase(this,VarRec,RelStep,uVar8);
        if ((psVar6 != (size_type *)0x0) && (psVar6[3] != 0)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Shape,*psVar6);
          if (*psVar6 == 0) {
            return true;
          }
          sVar4 = psVar6[3];
          puVar2 = (Shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar8 = 0;
          do {
            puVar2[uVar8] = *(unsigned_long *)(sVar4 + uVar8 * 8);
            uVar8 = uVar8 + 1;
          } while (uVar8 < *psVar6);
          return true;
        }
        uVar8 = uVar8 + 1;
        bVar1 = this->m_RandomAccessMode;
      }
    }
    else if (VarRec->LastJoinedShape != (size_t *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(Shape,VarRec->DimCount);
      if (VarRec->DimCount == 0) {
        return true;
      }
      psVar7 = VarRec->LastJoinedShape;
      puVar2 = (Shape->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        puVar2[uVar8] = psVar7[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 < VarRec->DimCount);
      return true;
    }
  }
  return false;
}

Assistant:

bool BP5Deserializer::VarShape(const VariableBase &Var, const size_t RelStep, Dims &Shape) const
{
    BP5VarRec *VarRec = LookupVarByKey((void *)&Var);
    if (!((VarRec->OrigShapeID == ShapeID::GlobalArray) ||
          (VarRec->OrigShapeID == ShapeID::JoinedArray)))
    {
        return false;
    }
    size_t AbsStep = RelStep;
    if (m_RandomAccessMode)
    {
        if (RelStep == adios2::EngineCurrentStep)
        {
            AbsStep = VarRec->AbsStepFromRel[Var.m_StepsStart];
        }
        else
        {
            AbsStep = VarRec->AbsStepFromRel[RelStep];
        }
    }
    if (m_FlattenSteps)
    {
        AbsStep = VarRec->LastTSAdded;
    }
    if (VarRec->OrigShapeID == ShapeID::GlobalArray)
    {
        // Take the first shape in any writer that wrote it, they should all be the same
        for (size_t WriterRank = 0; WriterRank < WriterCohortSize(AbsStep); WriterRank++)
        {
            MetaArrayRec *writer_meta_base =
                (MetaArrayRec *)GetMetadataBase(VarRec, AbsStep, WriterRank);
            if (writer_meta_base && writer_meta_base->Shape)
            {
                Shape.resize(writer_meta_base->Dims);
                for (size_t i = 0; i < writer_meta_base->Dims; i++)
                {
                    Shape[i] = writer_meta_base->Shape[i];
                }
                return true;
            }
        }
    }
    else
    {
        // Joined array case.  This was calculated during metadata installation
        if (VarRec->LastJoinedShape)
        {
            Shape.resize(VarRec->DimCount);
            for (size_t i = 0; i < VarRec->DimCount; i++)
            {
                Shape[i] = VarRec->LastJoinedShape[i];
            }
            return true;
        }
    }
    return false;
}